

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O2

void ncnn::gridsample_nearest_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined8 *puVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  
  iVar6 = dst->h * dst->w * dst->d;
  uVar7 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  uVar9 = (ulong)(uint)dst->c;
  if (dst->c < 1) {
    uVar9 = uVar7;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    sVar2 = src->cstep;
    sVar3 = src->elemsize;
    pvVar4 = src->data;
    puVar10 = (undefined8 *)(dst->cstep * uVar7 * dst->elemsize + (long)dst->data);
    pvVar5 = offset_value->data;
    for (lVar8 = 0; iVar6 != (int)lVar8; lVar8 = lVar8 + 1) {
      lVar11 = (long)*(int *)((long)pvVar5 + lVar8 * 4);
      if (lVar11 < 0) {
        uVar12 = 0;
        uVar13 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar4 + lVar11 * 4 + sVar2 * uVar7 * sVar3);
        uVar12 = *puVar1;
        uVar13 = puVar1[1];
      }
      *puVar10 = uVar12;
      puVar10[1] = uVar13;
      puVar10 = puVar10 + 2;
    }
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m128 _v = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            offset_ptr++;

            _mm_storeu_ps(dstptr, _v);
            dstptr += 4;
        }
    }
}